

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_funcs.c
# Opt level: O3

ktx_error_code_e ktxLoadVulkanLibrary(void)

{
  ktx_error_code_e kVar1;
  
  kVar1 = KTX_SUCCESS;
  if (ktxVulkanModuleHandle == (void *)0x0) {
    kVar1 = KTX_SUCCESS;
    ktxVulkanModuleHandle = (void *)dlopen(0,1);
    if (ktxVulkanModuleHandle == (void *)0x0) {
      ktxLoadVulkanLibrary_cold_1();
      kVar1 = KTX_LIBRARY_NOT_LINKED;
    }
  }
  return kVar1;
}

Assistant:

ktx_error_code_e
ktxLoadVulkanLibrary(void)
{
    if (ktxVulkanModuleHandle)
        return KTX_SUCCESS;

    ktxVulkanModuleHandle = GetVulkanModuleHandle(RTLD_LAZY);
    if (ktxVulkanModuleHandle == NULL) {
        fprintf(stderr, "Vulkan lib not linked or loaded by application.\n");
        // Normal use is for this constructor to be called by an
        // application that has completed OpenGL initialization. In that
        // case the only cause for failure would be a coding error in our
        // library loading. The only other cause would be an application
        // calling GLUpload without having initialized OpenGL.
#if defined(DEBUG)
        abort();
#else
        return KTX_LIBRARY_NOT_LINKED; // So release version doesn't crash.
#endif
    }

    return KTX_SUCCESS;
}